

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ostream *poVar1;
  byte bVar2;
  string *psVar3;
  uchar value;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  string local_60;
  string *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  local_40 = __return_storage_ptr__;
  Message::Message((Message *)&local_38);
  if (str->_M_string_length != 0) {
    poVar1 = (ostream *)(local_38._M_head_impl + 0x10);
    uVar6 = 0;
    do {
      bVar2 = (str->_M_dataplus)._M_p[uVar6];
      uVar7 = (uint)bVar2;
      if (bVar2 < 0x27) {
        if (bVar2 == 0x22) {
          lVar4 = 6;
          pcVar5 = "&quot;";
          if (is_attribute) goto LAB_001cee97;
          local_60._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
        }
        else {
          if (bVar2 == 0x26) {
            lVar4 = 5;
            pcVar5 = "&amp;";
            goto LAB_001cee97;
          }
LAB_001ceeb1:
          if (('\x1f' < (char)bVar2) || ((uVar7 < 0xe && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0)))) {
            if ((is_attribute) && ((uVar7 < 0xe && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"&#x",3);
              String::FormatByte_abi_cxx11_(&local_60,(String *)(ulong)uVar7,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                 (byte)local_60._M_dataplus._M_p),
                         local_60._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(byte)local_60._M_dataplus._M_p) !=
                  &local_60.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                         (byte)local_60._M_dataplus._M_p),
                                local_60.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_60._M_dataplus._M_p._0_1_ = bVar2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
            }
          }
        }
      }
      else {
        if (bVar2 == 0x27) {
          lVar4 = 6;
          pcVar5 = "&apos;";
          if (!is_attribute) {
            local_60._M_dataplus._M_p._0_1_ = 0x27;
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
            goto LAB_001cee9f;
          }
        }
        else {
          lVar4 = 4;
          if (uVar7 == 0x3e) {
            pcVar5 = "&gt;";
          }
          else {
            if (uVar7 != 0x3c) goto LAB_001ceeb1;
            pcVar5 = "&lt;";
          }
        }
LAB_001cee97:
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar4);
      }
LAB_001cee9f:
      uVar6 = uVar6 + 1;
    } while (uVar6 < str->_M_string_length);
  }
  psVar3 = local_40;
  StringStreamToString(local_40,local_38._M_head_impl);
  if (local_38._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))(local_38._M_head_impl);
  }
  return psVar3;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}